

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostats.cpp
# Opt level: O2

stats_data * __thiscall
foxxll::stats_data::operator+(stats_data *__return_storage_ptr__,stats_data *this,stats_data *a)

{
  vector<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_> *__result;
  file_stats_data *pfVar1;
  file_stats_data *pfVar2;
  double dVar3;
  double dVar4;
  file_stats_data *__first;
  file_stats_data *__last;
  pointer __x;
  pointer this_00;
  file_stats_data local_60;
  
  (__return_storage_ptr__->file_stats_data_list_).
  super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->file_stats_data_list_).
  super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->elapsed_ = 0.0;
  (__return_storage_ptr__->file_stats_data_list_).
  super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  __return_storage_ptr__->t_wait_read_ = 0.0;
  __return_storage_ptr__->t_wait_write_ = 0.0;
  __return_storage_ptr__->p_ios_ = 0.0;
  __return_storage_ptr__->t_wait = 0.0;
  __return_storage_ptr__->p_reads_ = 0.0;
  __return_storage_ptr__->p_writes_ = 0.0;
  this_00 = (this->file_stats_data_list_).
            super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pfVar1 = (this->file_stats_data_list_).
           super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  __x = (a->file_stats_data_list_).
        super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pfVar2 = (a->file_stats_data_list_).
           super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  __result = &__return_storage_ptr__->file_stats_data_list_;
  while ((__first = __x, __last = pfVar2, this_00 != pfVar1 &&
         (__first = this_00, __last = pfVar1, __x != pfVar2))) {
    if (this_00->device_id_ < __x->device_id_) {
      std::vector<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>::push_back
                (__result,this_00);
      this_00 = this_00 + 1;
    }
    else {
      if (this_00->device_id_ == __x->device_id_) {
        file_stats_data::operator+(&local_60,this_00,__x);
        std::vector<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>::
        emplace_back<foxxll::file_stats_data>(__result,&local_60);
        this_00 = this_00 + 1;
      }
      else {
        std::vector<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>::push_back
                  (__result,__x);
      }
      __x = __x + 1;
    }
  }
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<foxxll::file_stats_data_const*,std::back_insert_iterator<std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>>>
            (__first,__last,
             (back_insert_iterator<std::vector<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>_>
              )__result);
  dVar3 = this->p_writes_;
  dVar4 = a->p_writes_;
  __return_storage_ptr__->p_reads_ = a->p_reads_ + this->p_reads_;
  __return_storage_ptr__->p_writes_ = dVar4 + dVar3;
  dVar3 = this->t_wait;
  dVar4 = a->t_wait;
  __return_storage_ptr__->p_ios_ = a->p_ios_ + this->p_ios_;
  __return_storage_ptr__->t_wait = dVar4 + dVar3;
  dVar3 = this->t_wait_write_;
  dVar4 = a->t_wait_write_;
  __return_storage_ptr__->t_wait_read_ = a->t_wait_read_ + this->t_wait_read_;
  __return_storage_ptr__->t_wait_write_ = dVar4 + dVar3;
  __return_storage_ptr__->elapsed_ = this->elapsed_ + a->elapsed_;
  return __return_storage_ptr__;
}

Assistant:

stats_data stats_data::operator + (const stats_data& a) const
{
    stats_data s;

    tlx::merge_combine(
        file_stats_data_list_.cbegin(), file_stats_data_list_.cend(),
        a.file_stats_data_list_.cbegin(), a.file_stats_data_list_.cend(),
        std::back_inserter(s.file_stats_data_list_),
        FileStatsDataCompare(),
        [](const file_stats_data& a, const file_stats_data& b) {
            return a + b;
        }
    );

    s.p_reads_ = p_reads_ + a.p_reads_;
    s.p_writes_ = p_writes_ + a.p_writes_;
    s.p_ios_ = p_ios_ + a.p_ios_;
    s.t_wait = t_wait + a.t_wait;
    s.t_wait_read_ = t_wait_read_ + a.t_wait_read_;
    s.t_wait_write_ = t_wait_write_ + a.t_wait_write_;
    s.elapsed_ = elapsed_ + a.elapsed_;
    return s;
}